

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope::addOrChangeBinding
          (Scope *this,XMLCh *prefix,XMLCh *uri,MemoryManager *manager)

{
  bool bVar1;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar2;
  void *pvVar3;
  char16_t *pcVar4;
  XMLCh *oldUri;
  XMLCh *prefix_2;
  XMLCh *uri_2;
  RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> uriEnumer;
  XMLCh *uri_1;
  XMLCh *prefix_1;
  RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> preEnumer;
  MemoryManager *manager_local;
  XMLCh *uri_local;
  XMLCh *prefix_local;
  Scope *this_local;
  
  if (this->fUriHash == (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) {
    pRVar2 = (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,manager);
    RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOf(pRVar2,10,false,manager);
    this->fPrefixHash = pRVar2;
    pRVar2 = (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,manager);
    RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOf(pRVar2,10,false,manager);
    this->fUriHash = pRVar2;
    if (this->fBaseScopeWithBindings != (Scope *)0x0) {
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> *)&prefix_1,
                 this->fBaseScopeWithBindings->fPrefixHash,false,manager);
      while (bVar1 = RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::hasMoreElements
                               ((RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> *)
                                &prefix_1), bVar1) {
        pvVar3 = RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::nextElementKey
                           ((RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> *)
                            &prefix_1);
        uriEnumer.fMemoryManager =
             (MemoryManager *)
             RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                       (this->fBaseScopeWithBindings->fPrefixHash,pvVar3);
        RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                  (this->fPrefixHash,pvVar3,(char16_t *)uriEnumer.fMemoryManager);
      }
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> *)&uri_2,
                 this->fBaseScopeWithBindings->fUriHash,false,manager);
      while (bVar1 = RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::hasMoreElements
                               ((RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> *)
                                &uri_2), bVar1) {
        pvVar3 = RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::nextElementKey
                           ((RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> *)&uri_2)
        ;
        pcVar4 = RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                           (this->fBaseScopeWithBindings->fUriHash,pvVar3);
        RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fUriHash,pvVar3,pcVar4);
      }
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::~RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> *)&uri_2);
      RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher>::~RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<char16_t,_xercesc_4_0::StringHasher> *)&prefix_1);
    }
  }
  pcVar4 = RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get(this->fPrefixHash,prefix);
  if (pcVar4 != (char16_t *)0x0) {
    RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::removeKey(this->fUriHash,pcVar4);
  }
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fPrefixHash,prefix,uri);
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this->fUriHash,uri,prefix);
  return;
}

Assistant:

void DOMNormalizer::InScopeNamespaces::Scope::addOrChangeBinding(const XMLCh *prefix, const XMLCh *uri,
                                                                 MemoryManager* const manager) {
    //initialize and copy forward now we need to
    if(!fUriHash) {
        fPrefixHash = new (manager) RefHashTableOf<XMLCh>(10, (bool) false, manager);
        fUriHash = new (manager) RefHashTableOf<XMLCh>(10, (bool) false, manager);

        if(fBaseScopeWithBindings) {
            RefHashTableOfEnumerator<XMLCh> preEnumer(fBaseScopeWithBindings->fPrefixHash, false, manager);
            while(preEnumer.hasMoreElements()) {
                const XMLCh* prefix = (XMLCh*) preEnumer.nextElementKey();
                const XMLCh* uri  = fBaseScopeWithBindings->fPrefixHash->get((void*)prefix);

                //have to cast here because otherwise we have delete problems under windows :(
                fPrefixHash->put((void *)prefix, (XMLCh*)uri);
            }

            RefHashTableOfEnumerator<XMLCh> uriEnumer(fBaseScopeWithBindings->fUriHash, false, manager);
            while(uriEnumer.hasMoreElements()) {
                const XMLCh* uri = (XMLCh*) uriEnumer.nextElementKey();
                const XMLCh* prefix  = fBaseScopeWithBindings->fUriHash->get((void*)uri);

                //have to cast here because otherwise we have delete problems under windows :(
                fUriHash->put((void *)uri, (XMLCh*)prefix);
            }
        }
    }

    const XMLCh *oldUri = fPrefixHash->get(prefix);
    if(oldUri) {
        fUriHash->removeKey(oldUri);
    }

    fPrefixHash->put((void *)prefix, (XMLCh*)uri);
    fUriHash->put((void *)uri, (XMLCh*)prefix);
}